

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

qint64 __thiscall QFileDevice::writeData(QFileDevice *this,char *data,qint64 len)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QFileDevicePrivate *this_00;
  qint64 qVar4;
  pointer pQVar5;
  int extraout_var;
  long in_RDX;
  QFileDevice *in_RSI;
  long in_FS_OFFSET;
  FileError err;
  qint64 ret;
  bool buffered;
  QFileDevicePrivate *d;
  char *in_stack_ffffffffffffff78;
  FileError err_00;
  QAbstractFileEngine *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  FileError local_64;
  qint64 local_30;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x1982ea);
  unsetError((QFileDevice *)in_stack_ffffffffffffff80);
  this_00->lastWasWrite = true;
  local_c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       QFlags<QIODeviceBase::OpenModeFlag>::operator&
                 ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff80,
                  (OpenModeFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  if (((bVar2 == 0) ||
      (qVar4 = QIODevicePrivate::QRingBufferRef::size((QRingBufferRef *)in_stack_ffffffffffffff80),
      qVar4 + in_RDX <= (long)(this_00->super_QIODevicePrivate).writeBufferChunkSize)) ||
     (bVar1 = flush(in_RSI), bVar1)) {
    if ((bVar2 == 0) || ((this_00->super_QIODevicePrivate).writeBufferChunkSize < in_RDX)) {
      pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x1983a6);
      err_00 = (FileError)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      iVar3 = (*pQVar5->_vptr_QAbstractFileEngine[0x25])(pQVar5,in_RSI,in_RDX);
      local_30 = CONCAT44(extraout_var,iVar3);
      if (extraout_var < 0) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x1983da);
        local_64 = QAbstractFileEngine::error(in_stack_ffffffffffffff80);
        if (local_64 == UnspecifiedError) {
          local_64 = WriteError;
        }
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x198418);
        QAbstractFileEngine::errorString
                  ((QAbstractFileEngine *)CONCAT44(local_64,in_stack_ffffffffffffff88));
        QFileDevicePrivate::setError(this_00,err_00,(QString *)0x198438);
        QString::~QString((QString *)0x198442);
      }
    }
    else {
      QIODevicePrivate::QRingBufferRef::append
                ((QRingBufferRef *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x198466);
      local_30 = in_RDX;
    }
  }
  else {
    local_30 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

qint64 QFileDevice::writeData(const char *data, qint64 len)
{
    Q_D(QFileDevice);
    unsetError();
    d->lastWasWrite = true;
    bool buffered = !(d->openMode & Unbuffered);

    // Flush buffered data if this read will overflow.
    if (buffered && (d->writeBuffer.size() + len) > d->writeBufferChunkSize) {
        if (!flush())
            return -1;
    }

    // Write directly to the engine if the block size is larger than
    // the write buffer size.
    if (!buffered || len > d->writeBufferChunkSize) {
        const qint64 ret = d->fileEngine->write(data, len);
        if (ret < 0) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
        }
        return ret;
    }

    // Write to the buffer.
    d->writeBuffer.append(data, len);
    return len;
}